

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O1

void __thiscall cmCTestVC::~cmCTestVC(cmCTestVC *this)

{
  ~cmCTestVC(this);
  operator_delete(this,0x188);
  return;
}

Assistant:

cmCTestVC::~cmCTestVC() = default;